

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

schar lev_by_name(char *nam)

{
  xchar xVar1;
  xchar xVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  char cVar9;
  schar sVar10;
  xchar ledgerno;
  s_level **ppsVar11;
  char buf [256];
  char acStack_118 [256];
  
  iVar3 = strncasecmp(nam,"the ",4);
  pcVar7 = nam + (ulong)(iVar3 == 0) * 4;
  pcVar5 = strstri(pcVar7," level");
  if ((pcVar5 != (char *)0x0) && (pcVar6 = eos(pcVar7), pcVar5 == pcVar6 + -6)) {
    strcpy(acStack_118,pcVar7);
    pcVar7 = eos(acStack_118);
    pcVar7[-6] = '\0';
    pcVar7 = acStack_118;
  }
  iVar3 = strncasecmp(pcVar7,"gehennom",0xffffffffffffffff);
  if (((iVar3 == 0) || (iVar3 = strncasecmp(pcVar7,"hell",0xffffffffffffffff), iVar3 == 0)) &&
     (pcVar7 = "valley", u.uz.dnum == dungeon_topology.d_tower_dnum)) {
    pcVar7 = " to Vlad\'s tower";
  }
  ppsVar11 = &sp_levchn;
  do {
    ppsVar11 = &((s_level *)ppsVar11)->next->next;
    if ((s_level *)ppsVar11 == (s_level *)0x0) {
      uVar4 = find_branch(pcVar7,(proto_dungeon *)0x0);
      if ((int)uVar4 < 0) {
        pcVar7 = strstri(pcVar7," to ");
        if (pcVar7 == (char *)0x0) goto LAB_0018c253;
        uVar4 = find_branch(pcVar7 + 4,(proto_dungeon *)0x0);
        if ((int)uVar4 < 0) {
          return '\0';
        }
      }
      xVar2 = (xchar)(uVar4 >> 8);
      if ((flags.debug != '\0') ||
         (((levels[(ulong)uVar4 & 0xff] != (level *)0x0 &&
           (((levels[(ulong)uVar4 & 0xff]->flags).field_0xa & 0x40) == 0)) &&
          ((levels[(ulong)(uVar4 >> 8) & 0xff] != (level *)0x0 &&
           (((levels[(ulong)(uVar4 >> 8) & 0xff]->flags).field_0xa & 0x40) == 0)))))) {
        xVar1 = ledger_to_dnum(xVar2);
        ledgerno = (xchar)uVar4;
        if (xVar1 == u.uz.dnum) {
          ledgerno = xVar2;
        }
        xVar2 = ledger_to_dnum(ledgerno);
        xVar1 = ledger_to_dnum(ledgerno);
        return ledgerno + ~(byte)dungeons[xVar1].ledger_start + (char)dungeons[xVar2].depth_start;
      }
      goto LAB_0018c253;
    }
    iVar3 = strncasecmp(pcVar7,((s_level *)ppsVar11)->proto,0xffffffffffffffff);
  } while (iVar3 != 0);
  cVar8 = (((s_level *)ppsVar11)->dlevel).dnum;
  if ((((u.uz.dnum == cVar8) ||
       ((u.uz.dnum == dungeon_topology.d_valley_level.dnum &&
        (dungeon_topology.d_medusa_level.dnum == cVar8)))) ||
      (dungeon_topology.d_valley_level.dnum == cVar8 &&
       u.uz.dnum == dungeon_topology.d_medusa_level.dnum)) &&
     ((cVar9 = (((s_level *)ppsVar11)->dlevel).dlevel, flags.debug != '\0' ||
      ((levels[(char)((char)dungeons[cVar8].ledger_start + cVar9)] != (level *)0x0 &&
       (((levels[(char)((char)dungeons[cVar8].ledger_start + cVar9)]->flags).field_0xa & 0x40) == 0)
       ))))) {
    sVar10 = cVar9 + (char)dungeons[cVar8].depth_start + -1;
  }
  else {
LAB_0018c253:
    sVar10 = '\0';
  }
  return sVar10;
}

Assistant:

schar lev_by_name(const char *nam)
{
    schar lev = 0;
    s_level *slev;
    d_level dlev;
    const char *p;
    int idx, idxtoo;
    char buf[BUFSZ];

    /* allow strings like "the oracle level" to find "oracle" */
    if (!strncmpi(nam, "the ", 4)) nam += 4;
    if ((p = strstri(nam, " level")) != 0 && p == eos((char*)nam) - 6) {
	nam = strcpy(buf, nam);
	*(eos(buf) - 6) = '\0';
    }
    /* hell is the old name, and wouldn't match; gehennom would match its
       branch, yielding the castle level instead of the valley of the dead */
    if (!strcmpi(nam, "gehennom") || !strcmpi(nam, "hell")) {
	if (In_V_tower(&u.uz)) nam = " to Vlad's tower";  /* branch to... */
	else nam = "valley";
    }

    if ((slev = find_level(nam)) != 0) {
	dlev = slev->dlevel;
	idx = ledger_no(&dlev);
	if ((dlev.dnum == u.uz.dnum ||
		/* within same branch, or else main dungeon <-> gehennom */
		(u.uz.dnum == valley_level.dnum &&
			dlev.dnum == medusa_level.dnum) ||
		(u.uz.dnum == medusa_level.dnum &&
			dlev.dnum == valley_level.dnum)) &&
	    (/* either wizard mode or else seen and not forgotten */
	     wizard || (levels[idx] && !levels[idx]->flags.forgotten))) {
	    lev = depth(&slev->dlevel);
	}
    } else {	/* not a specific level; try branch names */
	idx = find_branch(nam, NULL);
	/* "<branch> to Xyzzy" */
	if (idx < 0 && (p = strstri(nam, " to ")) != 0)
	    idx = find_branch(p + 4, NULL);

	if (idx >= 0) {
	    idxtoo = (idx >> 8) & 0x00FF;
	    idx &= 0x00FF;
	    if (  /* either wizard mode, or else _both_ sides of branch seen */
		wizard ||
		((levels[idx] && !levels[idx]->flags.forgotten) &&
		 (levels[idxtoo] && !levels[idxtoo]->flags.forgotten))) {
		if (ledger_to_dnum(idxtoo) == u.uz.dnum) idx = idxtoo;
		dlev.dnum = ledger_to_dnum(idx);
		dlev.dlevel = ledger_to_dlev(idx);
		lev = depth(&dlev);
	    }
	}
    }
    return lev;
}